

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

string * __thiscall
glcts::PipelineStatisticsQueryUtilities::getGLSLStringForGSOutput_abi_cxx11_
          (string *__return_storage_ptr__,PipelineStatisticsQueryUtilities *this,
          _geometry_shader_output gs_output)

{
  TestError *this_00;
  int iVar1;
  _geometry_shader_output gs_output_local;
  string *result;
  
  iVar1 = (int)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (iVar1 == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"points");
  }
  else if (iVar1 == 1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"line_strip");
  }
  else {
    if (iVar1 != 2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized geometry shader output enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                 ,0x2c9);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"triangle_strip");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PipelineStatisticsQueryUtilities::getGLSLStringForGSOutput(_geometry_shader_output gs_output)
{
	std::string result;

	switch (gs_output)
	{
	case GEOMETRY_SHADER_OUTPUT_POINTS:
		result = "points";
		break;
	case GEOMETRY_SHADER_OUTPUT_LINE_STRIP:
		result = "line_strip";
		break;
	case GEOMETRY_SHADER_OUTPUT_TRIANGLE_STRIP:
		result = "triangle_strip";
		break;

	default:
	{
		TCU_FAIL("Unrecognized geometry shader output enum");
	}
	} /* switch (gs_output) */

	return result;
}